

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operators.hpp
# Opt level: O2

string * operator*(string *__return_storage_ptr__,
                  basic_string_view<char,_std::char_traits<char>_> *generic_string,uint integer)

{
  int iVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  iVar1 = integer + 1;
  while (iVar1 = iVar1 + -1, iVar1 != 0) {
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,generic_string);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator *( const T& generic_string, unsigned int integer ) 
 {
  std::string output;
  output.reserve( integer * generic_string.size() );

  while( integer -- ) 
   {
    output += generic_string;
   }
   
  return output;
 }